

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O2

void lj_serialize_dict_prep_mt(lua_State *L,GCtab *dict)

{
  uint64_t uVar1;
  uint uVar2;
  MSize MVar3;
  long lVar4;
  cTValue *pcVar5;
  TValue *pTVar6;
  uint32_t hbits;
  long lVar7;
  cTValue *key;
  ulong uVar8;
  
  if (dict->hmask == 0) {
    MVar3 = lj_tab_len(dict);
    if (MVar3 != 0) {
      uVar2 = 0x1f;
      if (MVar3 - 1 != 0) {
        for (; MVar3 - 1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      hbits = (uVar2 ^ 0xffffffe0) + 0x21;
      if (MVar3 == 1) {
        hbits = 1;
      }
      lj_tab_resize(L,dict,dict->asize,hbits);
      lVar7 = 8;
      for (uVar8 = 1; (MVar3 + 1 != uVar8 && (uVar8 < dict->asize)); uVar8 = uVar8 + 1) {
        uVar1 = (dict->array).ptr64;
        lVar4 = *(long *)(uVar1 + uVar8 * 8) >> 0x2f;
        if (lVar4 != -2) {
          if (lVar4 != -0xc) {
            lj_err_caller(L,LJ_ERR_BUFFER_BADOPT);
          }
          key = (cTValue *)(uVar1 + lVar7);
          pcVar5 = lj_tab_get(L,dict,key);
          if (pcVar5->u64 == 0xffffffffffffffff) {
            pTVar6 = lj_tab_newkey(L,dict,key);
            pTVar6->u64 = uVar8 - 1;
          }
        }
        lVar7 = lVar7 + 8;
      }
    }
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_serialize_dict_prep_mt(lua_State *L, GCtab *dict)
{
  if (!dict->hmask) {  /* No hash part means not prepared, yet. */
    MSize i, len = lj_tab_len(dict);
    if (!len) return;
    lj_tab_resize(L, dict, dict->asize, hsize2hbits(len));
    for (i = 1; i <= len && i < dict->asize; i++) {
      cTValue *o = arrayslot(dict, i);
      if (tvistab(o)) {
	if (tvisnil(lj_tab_get(L, dict, o))) {  /* Ignore dups. */
	  lj_tab_newkey(L, dict, o)->u64 = (uint64_t)(i-1);
	}
      } else if (!tvisfalse(o)) {
	lj_err_caller(L, LJ_ERR_BUFFER_BADOPT);
      }
    }
  }
}